

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial_test.hpp
# Opt level: O3

Polynomial<openjij::graph::Index,_double> * GeneratePolynomialInteractionsSparseInt2<double>(void)

{
  void *pvVar1;
  long lVar2;
  Polynomial<openjij::graph::Index,_double> *in_RDI;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  initializer_list<unsigned_long> __l_01;
  initializer_list<unsigned_long> __l_02;
  initializer_list<unsigned_long> __l_03;
  initializer_list<unsigned_long> __l_04;
  initializer_list<unsigned_long> __l_05;
  allocator_type local_247;
  allocator_type local_246;
  allocator_type local_245;
  allocator_type local_244;
  allocator_type local_243;
  allocator_type local_242;
  allocator_type local_241;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_240;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_228;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_210;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1e0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1b0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_198;
  unsigned_long local_180 [9];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_138;
  undefined8 local_120;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_118;
  undefined8 local_100;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_f8;
  undefined8 local_e0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_d8;
  undefined8 local_c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b8;
  undefined8 local_a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_98;
  undefined8 local_80;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  undefined8 local_60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_58;
  undefined8 local_40;
  unsigned_long local_38 [3];
  
  local_198.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_138,&local_198);
  local_120 = 0;
  local_180[2] = 0;
  __l._M_len = 1;
  __l._M_array = local_180 + 2;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_1b0,__l,&local_241);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_118,&local_1b0);
  local_100 = 0x8000000000000000;
  local_180[1] = 1;
  __l_00._M_len = 1;
  __l_00._M_array = local_180 + 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_1c8,__l_00,&local_242);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_f8,&local_1c8);
  local_e0 = 0;
  local_180[0] = 2;
  __l_01._M_len = 1;
  __l_01._M_array = local_180;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_1e0,__l_01,&local_243);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_d8,&local_1e0);
  local_c0 = 0xc000000000000000;
  local_180[7] = 0;
  local_180[8] = 1;
  __l_02._M_len = 2;
  __l_02._M_array = local_180 + 7;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_1f8,__l_02,&local_244);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_b8,&local_1f8);
  local_a0 = 0x4024000000000000;
  local_180[5] = 0;
  local_180[6] = 2;
  __l_03._M_len = 2;
  __l_03._M_array = local_180 + 5;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_210,__l_03,&local_245);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_98,&local_210);
  local_80 = 0x8000000000000000;
  local_180[3] = 1;
  local_180[4] = 2;
  __l_04._M_len = 2;
  __l_04._M_array = local_180 + 3;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_228,__l_04,&local_246);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_78,&local_228);
  local_60 = 0x4035000000000000;
  local_38[0] = 0;
  local_38[1] = 1;
  local_38[2] = 2;
  __l_05._M_len = 3;
  __l_05._M_array = local_38;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_240,__l_05,&local_247);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_58,&local_240);
  local_40 = 0xc05e000000000000;
  std::
  _Hashtable<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::pair<std::vector<unsigned_long,std::allocator<unsigned_long>>const,double>,std::allocator<std::pair<std::vector<unsigned_long,std::allocator<unsigned_long>>const,double>>,std::__detail::_Select1st,std::equal_to<std::vector<unsigned_long,std::allocator<unsigned_long>>>,cimod::vector_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _Hashtable<std::pair<std::vector<unsigned_long,std::allocator<unsigned_long>>const,double>const*>
            ();
  lVar2 = 0x100;
  do {
    pvVar1 = *(void **)((long)local_180 + lVar2 + 0x28);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)local_180 + lVar2 + 0x38) - (long)pvVar1);
    }
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != 0);
  if (local_240.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_240.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_240.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_240.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_228.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_228.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_210.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_210.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_210.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_210.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1f8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1c8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1b0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_198.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_198.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return in_RDI;
}

Assistant:

cimod::Polynomial<openjij::graph::Index, FloatType> GeneratePolynomialInteractionsSparseInt2() {
   return cimod::Polynomial<openjij::graph::Index, FloatType> {
      {{}, +0.0},
      {{0}, -0.0}, {{1}, +0.0}, {{2}, -2.0},
      {{0, 1}, +10.0}, {{0, 2}, -0.0}, {{1, 2}, +21.0},
      {{0, 1, 2}, -120}
   };
}